

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_SimpleArray<ON_UuidIndex> *a)

{
  ON_UuidIndex *pOVar1;
  bool local_31;
  bool local_21;
  ON__INT32 local_20;
  int iStack_1c;
  bool rc;
  int count;
  int i;
  ON_SimpleArray<ON_UuidIndex> *a_local;
  ON_BinaryArchive *this_local;
  
  local_20 = ON_SimpleArray<ON_UuidIndex>::Count(a);
  if (local_20 < 0) {
    local_20 = 0;
  }
  local_21 = WriteInt(this,local_20);
  iStack_1c = 0;
  while( true ) {
    local_31 = false;
    if (iStack_1c < local_20) {
      local_31 = local_21;
    }
    if (local_31 == false) break;
    pOVar1 = ON_SimpleArray<ON_UuidIndex>::operator[](a,iStack_1c);
    local_21 = WriteUuid(this,&pOVar1->m_id);
    if (local_21) {
      pOVar1 = ON_SimpleArray<ON_UuidIndex>::operator[](a,iStack_1c);
      local_21 = WriteInt(this,pOVar1->m_i);
    }
    iStack_1c = iStack_1c + 1;
  }
  return local_21;
}

Assistant:

bool
ON_BinaryArchive::WriteArray( const ON_SimpleArray<ON_UuidIndex>& a )
{
  int i, count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  for  ( i = 0; i < count && rc; i++ )
  {
    rc = WriteUuid( a[i].m_id );
    if (rc)
      rc = WriteInt( a[i].m_i );
  }
  return rc;
}